

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_task.cpp
# Opt level: O0

MPP_RET hal_task_hnd_get_info(HalTaskHnd hnd,void *info)

{
  long lVar1;
  HalTaskGroupImpl *group;
  HalTaskImpl *impl;
  void *info_local;
  HalTaskHnd hnd_local;
  
  if ((hnd == (HalTaskHnd)0x0) || (info == (void *)0x0)) {
    _mpp_log_l(2,"hal_task","found invaid input hnd %p info %p\n","hal_task_hnd_get_info",hnd,info);
    hnd_local._4_4_ = MPP_ERR_UNKNOW;
  }
  else {
    lVar1 = *(long *)((long)hnd + 0x10);
    if ((*(int *)(lVar1 + 4) <= *(int *)((long)hnd + 0x18)) &&
       (_mpp_log_l(2,"hal_task","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "impl->index < group->task_count","hal_task_hnd_get_info",0xe8),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    mpp_spinlock_lock((spinlock_t *)(lVar1 + 8));
    memcpy(info,*(void **)((long)hnd + 0x20),(long)*(int *)(lVar1 + 0x20));
    mpp_spinlock_unlock((spinlock_t *)(lVar1 + 8));
    hnd_local._4_4_ = MPP_OK;
  }
  return hnd_local._4_4_;
}

Assistant:

MPP_RET hal_task_hnd_get_info(HalTaskHnd hnd, void *info)
{
    if (NULL == hnd || NULL == info) {
        mpp_err_f("found invaid input hnd %p info %p\n", hnd, info);
        return MPP_ERR_UNKNOW;
    }

    HalTaskImpl *impl = (HalTaskImpl *)hnd;
    HalTaskGroupImpl *group = impl->group;

    mpp_assert(impl->index < group->task_count);

    mpp_spinlock_lock(&group->lock);
    memcpy(info, impl->data, group->size);
    mpp_spinlock_unlock(&group->lock);

    return MPP_OK;
}